

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O2

bool __thiscall clipp::group::depth_first_traverser::is_inside(depth_first_traverser *this,group *g)

{
  bool bVar1;
  
  if (g == (group *)0x0) {
    bVar1 = false;
  }
  else {
    bVar1 = std::
            any_of<__gnu_cxx::__normal_iterator<clipp::group::depth_first_traverser::context_const*,std::vector<clipp::group::depth_first_traverser::context,std::allocator<clipp::group::depth_first_traverser::context>>>,clipp::group::depth_first_traverser::is_inside(clipp::group_const*)const::_lambda(clipp::group::depth_first_traverser::context_const&)_1_>
                      ((this->stack_).
                       super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->stack_).
                       super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (anon_class_8_1_54a39807_for__M_pred)g);
  }
  return bVar1;
}

Assistant:

bool is_inside(const group* g) const noexcept {
            if(!g) return false;
            return std::any_of(stack_.begin(), stack_.end(),
                [g](const context& c) { return c.parent == g; });
        }